

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::FindMaxApproxErrorLeaf
               (VNode *vnode,double likelihood,double *bestAE,VNode **bestNode)

{
  bool bVar1;
  int d;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar2;
  QNode *qnode;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int local_34;
  int a;
  double curAE;
  VNode **bestNode_local;
  double *bestAE_local;
  double likelihood_local;
  VNode *vnode_local;
  
  bVar1 = VNode::IsLeaf(vnode);
  if (bVar1) {
    dVar6 = vnode->likelihood;
    d = VNode::depth(vnode);
    dVar3 = Globals::Discount(d);
    dVar4 = VNode::upper_bound(vnode);
    dVar5 = VNode::lower_bound(vnode);
    dVar6 = likelihood * dVar6 * dVar3 * (dVar4 - dVar5);
    if (*bestAE <= dVar6 && dVar6 != *bestAE) {
      *bestAE = dVar6;
      *bestNode = vnode;
    }
  }
  else {
    local_34 = 0;
    while( true ) {
      this = VNode::children(vnode);
      sVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
      if (sVar2 <= (ulong)(long)local_34) break;
      qnode = VNode::Child(vnode,local_34);
      FindMaxApproxErrorLeaf(qnode,likelihood,bestAE,bestNode);
      local_34 = local_34 + 1;
    }
  }
  return;
}

Assistant:

void AEMS::FindMaxApproxErrorLeaf(VNode* vnode, double likelihood,
	double& bestAE, VNode*& bestNode) {
	if (vnode->IsLeaf()) {
		double curAE = likelihood * vnode->likelihood * Globals::Discount(vnode->depth())
			* (vnode->upper_bound() - vnode->lower_bound());
		if (curAE > bestAE) {
			bestAE = curAE;
			bestNode = vnode;
		}
	} else {
		for (int a = 0; a < vnode->children().size(); a++) {
			FindMaxApproxErrorLeaf(vnode->Child(a), likelihood, bestAE,
				bestNode);
		}
	}
}